

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O3

RecGroup __thiscall wasm::anon_unknown_0::RecGroupStore::insert(RecGroupStore *this,RecGroup group)

{
  uint uVar1;
  HeapType HVar2;
  Field *pFVar3;
  long *plVar4;
  _Hash_node_base *p_Var5;
  undefined8 *puVar6;
  undefined8 uVar7;
  bool bVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  _Hash_node_base **__s;
  _Hash_node_base *p_Var13;
  ulong uVar14;
  size_type __n;
  RecGroupStore *pRVar15;
  long *plVar16;
  Type a;
  _Hash_node_base *p_Var17;
  long *plVar18;
  RecGroupStore *pRVar19;
  const_iterator __begin2;
  Field *pFVar20;
  const_iterator __end2;
  RecGroupStore *pRVar21;
  long lVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  long local_50;
  new_allocator<std::__detail::_Hash_node_base_*> local_41;
  Type TStack_40;
  __buckets_alloc_type __alloc;
  pointer __ptr_1;
  
  pRVar21 = (RecGroupStore *)&DAT_00000001;
  if (((ulong)this & 1) == 0) {
    lVar22 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
             (this->mutex).super___mutex_base._M_mutex.__align;
    if (lVar22 == 0) {
      pRVar15 = (RecGroupStore *)0x0;
      goto LAB_009be35b;
    }
    pRVar21 = (RecGroupStore *)(lVar22 >> 3);
  }
  pRVar19 = (RecGroupStore *)0x0;
  pRVar15 = pRVar21;
  do {
    uVar14 = (ulong)this & 0xfffffffffffffffe;
    if (((ulong)this & 1) == 0) {
      uVar14 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + (long)pRVar19 * 8);
    }
    if (uVar14 < 0xe) {
      uVar9 = uVar14 + 0x9e3779b97f4a8c15;
    }
    else {
      if (*(char *)(uVar14 + 1) == '\0') {
        __assert_fail("info.isFinalized",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                      ,0x84b,
                      "size_t wasm::(anonymous namespace)::RecGroupHasher::hash(const HeapTypeInfo &) const"
                     );
      }
      HVar2.id = *(uintptr_t *)(uVar14 + 8);
      uVar9 = (ulong)(HVar2.id != 0);
      TStack_40.id = (uintptr_t)pRVar19;
      if (HVar2.id != 0) {
        sVar10 = RecGroupHasher::hash((RecGroupHasher *)this,HVar2);
        uVar9 = uVar9 ^ sVar10 + 0x9e3779b97f4a8c15;
      }
      uVar1 = *(uint *)(uVar14 + 0x20);
      switch((ulong)uVar1) {
      case 0:
        handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x853);
      case 1:
        sVar10 = RecGroupHasher::hash((RecGroupHasher *)this,(Type)*(uintptr_t *)(uVar14 + 0x28));
        sVar11 = RecGroupHasher::hash((RecGroupHasher *)this,(Type)*(uintptr_t *)(uVar14 + 0x30));
        uVar12 = (sVar10 >> 4) + sVar11 + sVar10 * 0x1000 + -0x61c8864680b583eb ^ sVar10;
        break;
      case 2:
        pFVar20 = *(Field **)(uVar14 + 0x28);
        pFVar3 = *(Field **)(uVar14 + 0x30);
        uVar12 = (long)pFVar3 - (long)pFVar20 >> 4;
        for (; pFVar3 != pFVar20; pFVar20 = pFVar20 + 1) {
          sVar10 = RecGroupHasher::hash((RecGroupHasher *)this,pFVar20);
          uVar12 = uVar12 ^ (uVar12 >> 4) + sVar10 + uVar12 * 0x1000 + -0x61c8864680b583eb;
        }
        break;
      case 3:
        uVar12 = RecGroupHasher::hash((RecGroupHasher *)this,(Field *)(uVar14 + 0x28));
        break;
      default:
        handle_unreachable("unexpected kind",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                           ,0x85e);
      }
      uVar9 = (uVar9 >> 4) + uVar9 * 0x1000 + -0x61c8864680b583eb + (ulong)uVar1 ^ uVar9;
      uVar9 = (uVar9 * 0x1000 + -0x61c8864680b583eb + (uVar9 >> 4) + uVar12 ^ uVar9) +
              0x9e3779b97f4a7c15;
      pRVar19 = (RecGroupStore *)TStack_40.id;
    }
    pRVar15 = (RecGroupStore *)
              ((ulong)pRVar15 ^
              (long)pRVar15 * 0x1000 + -0x61c8864680b583eb + ((ulong)pRVar15 >> 4) +
              (uVar14 < 0xe ^ uVar9));
    pRVar19 = (RecGroupStore *)((long)&(pRVar19->mutex).super___mutex_base._M_mutex + 1);
  } while (pRVar19 != pRVar21);
LAB_009be35b:
  uVar14 = (ulong)pRVar15 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_;
  plVar18 = *(long **)(wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ + uVar14 * 8);
  if (plVar18 != (long *)0x0) {
    pRVar21 = (RecGroupStore *)((long *)*plVar18)[2];
    plVar4 = (long *)*plVar18;
    do {
      plVar16 = plVar4;
      if (pRVar21 == pRVar15) {
        a.id = plVar16[1];
        if ((RecGroupStore *)a.id == this) {
          return (RecGroup)a.id;
        }
        lVar22 = 1;
        local_50 = 1;
        if (((ulong)this & 1) == 0) {
          local_50 = *(long *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) -
                     (this->mutex).super___mutex_base._M_mutex.__align >> 3;
        }
        if ((a.id & 1) == 0) {
          lVar22 = *(long *)((long)&(((RecGroupStore *)a.id)->mutex).super___mutex_base._M_mutex + 8
                            ) - (((RecGroupStore *)a.id)->mutex).super___mutex_base._M_mutex.__align
                   >> 3;
        }
        if (local_50 == lVar22) {
          if (local_50 == 0) {
            return (RecGroup)a.id;
          }
          uVar9 = a.id & 0xfffffffffffffffe;
          lVar22 = 0;
          TStack_40.id = a.id;
          do {
            uVar12 = (ulong)this & 0xfffffffffffffffe;
            if (((ulong)this & 1) == 0) {
              uVar12 = *(ulong *)((this->mutex).super___mutex_base._M_mutex.__align + lVar22 * 8);
            }
            uVar23 = uVar9;
            if ((a.id & 1) == 0) {
              uVar23 = *(ulong *)(*(long *)a.id + lVar22 * 8);
            }
            if (uVar12 != uVar23) {
              if (((((uVar12 < 0xe) || (uVar23 < 0xe)) ||
                   (HVar2.id = *(uintptr_t *)(uVar12 + 8),
                   (HVar2.id != 0) == (*(long *)(uVar23 + 8) == 0))) ||
                  ((HVar2.id != 0 &&
                   (bVar8 = RecGroupEquator::eq((RecGroupEquator *)this,(HeapType)a.id,HVar2),
                   a.id = TStack_40.id, !bVar8)))) ||
                 (*(int *)(uVar12 + 0x20) != *(int *)(uVar23 + 0x20))) break;
              switch(*(int *)(uVar12 + 0x20)) {
              case 0:
                handle_unreachable("Basic HeapTypeInfo should have been canonicalized",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                   ,0x8d1);
              case 1:
                bVar8 = RecGroupEquator::eq((RecGroupEquator *)this,a,
                                            (Type)*(uintptr_t *)(uVar12 + 0x28));
                if (!bVar8) goto LAB_009be559;
                bVar8 = RecGroupEquator::eq((RecGroupEquator *)this,TStack_40,
                                            (Type)*(uintptr_t *)(uVar12 + 0x30));
                break;
              case 2:
                pFVar20 = *(Field **)(uVar12 + 0x28);
                pFVar3 = *(Field **)(uVar12 + 0x30);
                if ((long)pFVar3 - (long)pFVar20 ==
                    *(long *)(uVar23 + 0x30) - *(long *)(uVar23 + 0x28)) {
                  for (; pFVar20 != pFVar3; pFVar20 = pFVar20 + 1) {
                    bVar8 = RecGroupEquator::eq((RecGroupEquator *)this,(Field *)a.id,pFVar20);
                    if (!bVar8) goto LAB_009be559;
                    a.id = TStack_40.id;
                  }
                  goto LAB_009be54a;
                }
                goto LAB_009be559;
              case 3:
                bVar8 = RecGroupEquator::eq((RecGroupEquator *)this,(Field *)a.id,
                                            (Field *)(uVar12 + 0x28));
                break;
              default:
                handle_unreachable("unexpected kind",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm-type.cpp"
                                   ,0x8d9);
              }
              a.id = TStack_40.id;
              if (bVar8 == false) break;
            }
LAB_009be54a:
            lVar22 = lVar22 + 1;
            if (lVar22 == local_50) {
              if (*plVar18 != 0) {
                return (RecGroup)*(uintptr_t *)(*plVar18 + 8);
              }
              goto LAB_009be59e;
            }
          } while( true );
        }
      }
LAB_009be559:
      plVar4 = (long *)*plVar16;
    } while ((plVar4 != (long *)0x0) &&
            (pRVar21 = (RecGroupStore *)plVar4[2], plVar18 = plVar16,
            (ulong)pRVar21 % (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ ==
            uVar14));
  }
LAB_009be59e:
  TStack_40.id = (uintptr_t)operator_new(0x18);
  *(undefined8 *)TStack_40.id = 0;
  *(RecGroupStore **)(TStack_40.id + 8) = this;
  auVar24 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      (0xda8338,wasm::(anonymous_namespace)::globalRecGroupStore._48_8_,
                       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_);
  __n = auVar24._8_8_;
  if ((auVar24 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (__n == 1) {
      wasm::(anonymous_namespace)::globalRecGroupStore._88_8_ = 0;
      __s = (_Hash_node_base **)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x58);
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      (&local_41,__n,(void *)0x0);
      memset(__s,0,__n * 8);
    }
    p_Var17 = (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = 0;
    if (p_Var17 != (_Hash_node_base *)0x0) {
      uVar14 = 0;
      do {
        p_Var5 = p_Var17->_M_nxt;
        uVar9 = (ulong)p_Var17[2]._M_nxt % __n;
        if (__s[uVar9] == (_Hash_node_base *)0x0) {
          p_Var17->_M_nxt =
               (_Hash_node_base *)wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
          wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = p_Var17;
          __s[uVar9] = (_Hash_node_base *)(wasm::(anonymous_namespace)::globalRecGroupStore + 0x38);
          if (p_Var17->_M_nxt != (_Hash_node_base *)0x0) {
            p_Var13 = (_Hash_node_base *)(__s + uVar14);
            goto LAB_009be68b;
          }
        }
        else {
          p_Var17->_M_nxt = __s[uVar9]->_M_nxt;
          p_Var13 = __s[uVar9];
          uVar9 = uVar14;
LAB_009be68b:
          p_Var13->_M_nxt = p_Var17;
        }
        p_Var17 = p_Var5;
        uVar14 = uVar9;
      } while (p_Var5 != (_Hash_node_base *)0x0);
    }
    if (wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ != 0xda8348) {
      operator_delete((void *)wasm::(anonymous_namespace)::globalRecGroupStore._40_8_,
                      wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ << 3);
    }
    uVar14 = (ulong)pRVar15 % __n;
    wasm::(anonymous_namespace)::globalRecGroupStore._40_8_ = __s;
    wasm::(anonymous_namespace)::globalRecGroupStore._48_8_ = __n;
  }
  lVar22 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
  *(RecGroupStore **)(TStack_40.id + 0x10) = pRVar15;
  uVar7 = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
  puVar6 = *(undefined8 **)(lVar22 + uVar14 * 8);
  if (puVar6 == (undefined8 *)0x0) {
    *(undefined8 *)TStack_40.id = wasm::(anonymous_namespace)::globalRecGroupStore._56_8_;
    wasm::(anonymous_namespace)::globalRecGroupStore._56_8_ = TStack_40.id;
    if (uVar7 != 0) {
      *(uintptr_t *)
       (lVar22 + (*(ulong *)(uVar7 + 0x10) %
                 (ulong)wasm::(anonymous_namespace)::globalRecGroupStore._48_8_) * 8) = TStack_40.id
      ;
      lVar22 = wasm::(anonymous_namespace)::globalRecGroupStore._40_8_;
    }
    *(undefined8 *)(lVar22 + uVar14 * 8) = 0xda8328;
  }
  else {
    *(undefined8 *)TStack_40.id = *puVar6;
    **(undefined8 **)(lVar22 + uVar14 * 8) = TStack_40.id;
  }
  wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ =
       wasm::(anonymous_namespace)::globalRecGroupStore._64_8_ + 1;
  return (RecGroup)(uintptr_t)this;
}

Assistant:

RecGroup insert(RecGroup group) {
    RecGroupStructure structure{group};
    auto [it, inserted] = canonicalGroups.insert(structure);
    if (inserted) {
      return group;
    } else {
      return it->group;
    }
  }